

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O1

ArrayRef<int> * __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::ReadIntSuffix
          (ArrayRef<int> *__return_storage_ptr__,BasicProblem<mp::BasicProblemParams<int>_> *this,
          SuffixDef<int> *sufdef)

{
  pointer pcVar1;
  CStringRef msg;
  StringRef name;
  SuffixBase SVar2;
  SuffixBase SVar3;
  Error *this_00;
  int *in_R8;
  bool bVar4;
  ArrayRef<int> suf_int;
  ArrayRef<int> local_a8;
  undefined1 local_74 [8];
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  uint local_60;
  long *local_58 [2];
  long local_48 [2];
  char *local_38;
  size_t sStack_30;
  
  SVar2.impl_ = (Impl *)FindSuffix<int>(this,sufdef);
  if ((SuffixBase)SVar2.impl_ == (SuffixBase)0x0) {
    local_a8.data_ = (int *)0x0;
    local_a8.size_ = 0;
  }
  else {
    local_a8.data_ = *(int **)&(SVar2.impl_)->field_3;
    local_a8.size_ = (size_t)(SVar2.impl_)->num_values;
  }
  local_a8.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  if (local_a8.size_ == 0) {
    local_74._4_4_ = *(undefined4 *)&(sufdef->name_).data_;
    uStack_6c = *(undefined4 *)((long)&(sufdef->name_).data_ + 4);
    uStack_68 = (undefined4)(sufdef->name_).size_;
    uStack_64 = *(undefined4 *)((long)&(sufdef->name_).size_ + 4);
    local_60 = sufdef->kind_;
    pcVar1 = (sufdef->tab_)._M_dataplus._M_p;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar1,pcVar1 + (sufdef->tab_)._M_string_length);
    name.data_._4_4_ = uStack_6c;
    name.data_._0_4_ = local_74._4_4_;
    name.size_._0_4_ = uStack_68;
    name.size_._4_4_ = uStack_64;
    SVar3.impl_ = (Impl *)BasicSuffixSet<std::allocator<char>_>::Find
                                    ((this->super_SuffixManager).suffixes_ + (local_60 & 3),name);
    SVar2.impl_ = (Impl *)0x0;
    if (((SuffixBase)SVar3.impl_ != (SuffixBase)0x0) && (((SVar3.impl_)->kind & 4) != 0)) {
      SVar2.impl_ = SVar3.impl_;
    }
    if (SVar2.impl_ == (Impl *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = (SVar2.impl_)->num_values == 0;
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if (!bVar4) {
      this_00 = (Error *)__cxa_allocate_exception(0x18);
      local_38 = (sufdef->name_).data_;
      sStack_30 = (sufdef->name_).size_;
      local_74._0_4_ = sufdef->kind_;
      fmt::format<fmt::BasicStringRef<char>,int>
                ((string *)(local_74 + 4),
                 (fmt *)"Expected integer suffix .{}, kind {},\nbut fractional values provided",
                 (CStringRef)&local_38,(BasicStringRef<char> *)local_74,in_R8);
      msg.data_._4_4_ = uStack_6c;
      msg.data_._0_4_ = local_74._4_4_;
      Error::Error(this_00,msg,-1);
      __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
    (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->data_ = (int *)0x0;
    (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->size_ = 0;
  }
  else {
    (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->data_ = (int *)0x0;
    (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->size_ = 0;
    ArrayRef<int>::init_from_rvalue<mp::ArrayRef<int>>(__return_storage_ptr__,&local_a8);
  }
  if (local_a8.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ArrayRef<int> ReadIntSuffix(const SuffixDef<int>& sufdef) {
    auto suf_int = ReadSuffix_OneTypeOnly(sufdef);
    if (!suf_int) {
      auto suf_dbl = ReadSuffix_OneTypeOnly(sufdef.to_type<double>());
      MP_ASSERT_ALWAYS(!suf_dbl,
                       fmt::format("Expected integer suffix .{}, kind {},\n"
                                   "but fractional values provided",
                                   sufdef.name(), sufdef.kind()));
      return {};
    }
    return suf_int;
  }